

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

int err_unwind_jit(int version,int actions,uint64_t uexclass,_Unwind_Exception *uex,
                  _Unwind_Context *ctx)

{
  long lVar1;
  uintptr_t uVar2;
  uintptr_t stub;
  uintptr_t addr;
  uint64_t uStack_38;
  ExitNo exitno;
  global_State *g;
  _Unwind_Context *ctx_local;
  _Unwind_Exception *uex_local;
  uint64_t uexclass_local;
  int local_10;
  int actions_local;
  int version_local;
  
  if ((version == 1) && ((uexclass ^ 0x4c55414a49543200) < 0x100)) {
    if ((actions & 1U) == 0) {
      if ((actions & 2U) == 0) {
        actions_local = 3;
      }
      else {
        uStack_38 = uex[1].exclass;
        g = (global_State *)ctx;
        ctx_local = (_Unwind_Context *)uex;
        uex_local = (_Unwind_Exception *)uexclass;
        uexclass_local._4_4_ = actions;
        local_10 = version;
        lVar1 = _Unwind_GetIP(ctx);
        uVar2 = lj_trace_unwind((jit_State *)(uStack_38 + 0x2e0),lVar1 - 1,
                                (ExitNo *)((long)&addr + 4));
        if (uVar2 == 0) {
          actions_local = 2;
        }
        else {
          *(uint *)(uStack_38 + 0xeb0) = (uint)uex_local & 0xff;
          _Unwind_SetIP(g,uVar2);
          actions_local = 7;
        }
      }
    }
    else {
      actions_local = 6;
    }
  }
  else {
    actions_local = 3;
  }
  return actions_local;
}

Assistant:

static int err_unwind_jit(int version, int actions,
  uint64_t uexclass, _Unwind_Exception *uex, _Unwind_Context *ctx)
{
  /* NYI: FFI C++ exception interoperability. */
  if (version != 1 || !LJ_UEXCLASS_CHECK(uexclass))
    return _URC_FATAL_PHASE1_ERROR;
  if ((actions & _UA_SEARCH_PHASE)) {
    return _URC_HANDLER_FOUND;
  }
  if ((actions & _UA_CLEANUP_PHASE)) {
    global_State *g = *(global_State **)(uex+1);
    ExitNo exitno;
    uintptr_t addr = _Unwind_GetIP(ctx);  /* Return address _after_ call. */
    uintptr_t stub = lj_trace_unwind(G2J(g), addr - sizeof(MCode), &exitno);
    lj_assertG(tvref(g->jit_base), "unexpected throw across mcode frame");
    if (stub) {  /* Jump to side exit to unwind the trace. */
      G2J(g)->exitcode = LJ_UEXCLASS_ERRCODE(uexclass);
#ifdef LJ_TARGET_MIPS
      _Unwind_SetGR(ctx, 4, stub);
      _Unwind_SetGR(ctx, 5, exitno);
      _Unwind_SetIP(ctx, (uintptr_t)(void *)lj_vm_unwind_stub);
#else
      _Unwind_SetIP(ctx, stub);
#endif
      return _URC_INSTALL_CONTEXT;
    }
    return _URC_FATAL_PHASE2_ERROR;
  }
  return _URC_FATAL_PHASE1_ERROR;
}